

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O2

Expression * __thiscall
wasm::MultiMemoryLowering::Replacer::makeAddGtuMemoryTrap
          (Replacer *this,Expression *leftOperand,Expression *rightOperand,Name memory)

{
  pointer pNVar1;
  mapped_type *pmVar2;
  Call *limit;
  Expression *pEVar3;
  Name target;
  undefined1 local_48 [8];
  Name memory_local;
  
  memory_local.super_IString.str._M_len = memory.super_IString.str._M_str;
  local_48 = memory.super_IString.str._M_len;
  pmVar2 = std::__detail::
           _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::at((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 *)&this->parent->memoryIdxMap,(key_type *)local_48);
  pNVar1 = (this->parent->memorySizeNames).
           super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
           super__Vector_impl_data._M_start;
  memory_local.super_IString.str._M_str = (char *)0x0;
  target.super_IString.str._M_str = pNVar1[*pmVar2].super_IString.str._M_str;
  target.super_IString.str._M_len = pNVar1[*pmVar2].super_IString.str._M_len;
  limit = Builder::makeCall(&this->builder,target,
                            (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                            &memory_local.super_IString.str._M_str,
                            (Type)(this->parent->pointerType).id,false);
  pEVar3 = makeAddGtuTrap(this,leftOperand,rightOperand,(Expression *)limit);
  std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
            ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
             &memory_local.super_IString.str._M_str);
  return pEVar3;
}

Assistant:

Expression* makeAddGtuMemoryTrap(Expression* leftOperand,
                                     Expression* rightOperand,
                                     Name memory) {
      auto memoryIdx = parent.memoryIdxMap.at(memory);
      Name memorySizeFunc = parent.memorySizeNames[memoryIdx];
      Expression* gtuMemoryTrap = makeAddGtuTrap(
        leftOperand,
        rightOperand,
        builder.makeCall(memorySizeFunc, {}, parent.pointerType));
      return gtuMemoryTrap;
    }